

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void TrimInitialSpace(TidyDocImpl *doc,Node *element,Node *text)

{
  uint uVar1;
  uint uVar2;
  Lexer *lexer_00;
  tmbstr ptVar3;
  Bool BVar4;
  Node *pNVar5;
  Node *node;
  Node *prev;
  Lexer *lexer;
  Node *text_local;
  Node *element_local;
  TidyDocImpl *doc_local;
  
  lexer_00 = doc->lexer;
  BVar4 = prvTidynodeIsText(text);
  if (((BVar4 != no) && (lexer_00->lexbuf[text->start] == ' ')) && (text->start < text->end)) {
    if (((element->tag->model & 0x10) != 0) && ((element->tag->model & 0x400) == 0)) {
      pNVar5 = element->prev;
      BVar4 = prvTidynodeIsText(pNVar5);
      if (BVar4 == no) {
        pNVar5 = prvTidyNewNode(lexer_00->allocator,lexer_00);
        uVar2 = element->start;
        element->start = uVar2 + 1;
        pNVar5->start = uVar2;
        pNVar5->end = element->start;
        lexer_00->lexbuf[pNVar5->start] = ' ';
        prvTidyInsertNodeBeforeElement(element,pNVar5);
      }
      else {
        if ((pNVar5->end == 0) || (lexer_00->lexbuf[pNVar5->end - 1] != ' ')) {
          ptVar3 = lexer_00->lexbuf;
          uVar1 = pNVar5->end;
          pNVar5->end = uVar1 + 1;
          ptVar3[uVar1] = ' ';
        }
        element->start = element->start + 1;
      }
    }
    text->start = text->start + 1;
  }
  return;
}

Assistant:

static void TrimInitialSpace( TidyDocImpl* doc, Node *element, Node *text )
{
    Lexer* lexer = doc->lexer;
    Node *prev, *node;

    if ( TY_(nodeIsText)(text) &&
         lexer->lexbuf[text->start] == ' ' &&
         text->start < text->end )
    {
        if ( (element->tag->model & CM_INLINE) &&
             !(element->tag->model & CM_FIELD) )
        {
            prev = element->prev;

            if (TY_(nodeIsText)(prev))
            {
                if (prev->end == 0 || lexer->lexbuf[prev->end - 1] != ' ')
                    lexer->lexbuf[(prev->end)++] = ' ';

                ++(element->start);
            }
            else /* create new node */
            {
                node = TY_(NewNode)(lexer->allocator, lexer);
                node->start = (element->start)++;
                node->end = element->start;
                lexer->lexbuf[node->start] = ' ';
                TY_(InsertNodeBeforeElement)(element ,node);
                DEBUG_LOG(SPRTF("TrimInitialSpace: Created text node, inserted before <%s>\n",
                    (element->element ? element->element : "unknown")));
            }
        }

        /* discard the space in current node */
        ++(text->start);
    }
}